

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O2

lys_node * ly_ctx_get_node(ly_ctx *ctx,lys_node *start,char *nodeid,int output)

{
  lys_node *plVar1;
  
  if ((nodeid != (char *)0x0 && (ctx != (ly_ctx *)0x0 || start != (lys_node *)0x0)) &&
     ((start != (lys_node *)0x0 || (*nodeid == '/')))) {
    if (ctx == (ly_ctx *)0x0) {
      ctx = start->module->ctx;
    }
    plVar1 = resolve_json_nodeid(nodeid,ctx,start,output);
    return plVar1;
  }
  ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid arguments (%s()).","ly_ctx_get_node");
  return (lys_node *)0x0;
}

Assistant:

lys_node *
ly_ctx_get_node(const struct ly_ctx *ctx, const struct lys_node *start, const char *nodeid, int output)
{
    const struct lys_node *node;

    if ((!ctx && !start) || !nodeid || ((nodeid[0] != '/') && !start)) {
        LOGARG;
        return NULL;
    }

    if (!ctx) {
        ctx = start->module->ctx;
    }

    /* sets error and everything */
    node = resolve_json_nodeid(nodeid, ctx, start, output);

    return node;
}